

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> __thiscall
fmt::v8::detail::
write_int_noinline<char32_t,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,unsigned_long>
          (detail *this,back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> out,
          write_int_arg<unsigned_long> arg,basic_format_specs<char32_t> *specs,locale_ref loc)

{
  ulong uVar1;
  presentation_type pVar2;
  long lVar3;
  uint uVar4;
  char *digits;
  back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> bVar5;
  uint *puVar6;
  char *pcVar7;
  byte *pbVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  basic_format_specs<char32_t> *specs_00;
  int *piVar14;
  char *pcVar15;
  buffer<char32_t> *buf;
  int iVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  bool bVar20;
  format_decimal_result<char32_t_*> fVar21;
  write_int_data<char32_t> data;
  char32_t buffer [20];
  back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> local_a0;
  write_int_data<char32_t> local_98;
  anon_class_40_3_03e05ccd_conflict local_88 [2];
  
  specs_00 = arg._8_8_;
  pVar2 = specs_00->type;
  uVar13 = (uint)arg.abs_value;
  local_a0.container = (buffer<char32_t> *)this;
  local_88[0].write_digits.abs_value = (unsigned_long)out.container;
  switch(pVar2) {
  case none:
  case dec:
    if (((specs_00->field_0xa & 1) != 0) &&
       (bVar20 = write_int_localized<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,unsigned_long,char32_t>
                           (&local_a0,(unsigned_long)out.container,uVar13,specs_00,(locale_ref)specs
                           ), bVar20)) {
      return (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)local_a0.container;
    }
    bVar5.container = local_a0.container;
    lVar17 = 0x3f;
    if (((ulong)out.container | 1) != 0) {
      for (; ((ulong)out.container | 1) >> lVar17 == 0; lVar17 = lVar17 + -1) {
      }
    }
    iVar16 = (uint)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar17] -
             (uint)(out.container <
                   *(buffer<char32_t> **)
                    (do_count_digits(unsigned_long)::zero_or_powers_of_10 +
                    (ulong)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar17] * 8));
    if (specs_00->precision != -1 || specs_00->width != 0) {
      write_int_data<char32_t>::write_int_data(&local_98,iVar16,uVar13,specs_00);
      local_88[0].data.size = local_98.size;
      local_88[0].data.padding = local_98.padding;
      local_88[0].prefix = uVar13;
      local_88[0].write_digits.num_digits = iVar16;
      bVar5 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,char32_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,char32_t,fmt::v8::detail::write_int<char32_t,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char32_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>)_1_>(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,int,unsigned_int,fmt::v8::basic_format_specs<char32_t>const&,fmt::v8::detail::write_int<char32_t,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char32_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>)_1_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>)_1_&>
                        (bVar5,specs_00,local_98.size,local_98.size,
                         (anon_class_40_3_03e05ccd *)local_88);
      return (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)bVar5.container;
    }
    if (-1 < iVar16) {
      if ((uVar13 != 0) &&
         (((undefined1  [16])arg & (undefined1  [16])0xffffff) != (undefined1  [16])0x0)) {
        uVar10 = (local_a0.container)->size_;
        uVar13 = uVar13 & 0xffffff;
        do {
          uVar1 = uVar10 + 1;
          uVar11 = uVar10;
          uVar10 = uVar1;
          if ((bVar5.container)->capacity_ < uVar1) {
            (**(bVar5.container)->_vptr_buffer)(bVar5.container);
            uVar11 = (bVar5.container)->size_;
            uVar10 = uVar11 + 1;
          }
          (bVar5.container)->size_ = uVar10;
          (bVar5.container)->ptr_[uVar11] = uVar13 & 0xff;
          bVar20 = 0xff < uVar13;
          uVar13 = uVar13 >> 8;
        } while (bVar20);
      }
      fVar21 = format_decimal<char32_t,unsigned_long>
                         ((char32_t *)local_88,(unsigned_long)out.container,iVar16);
      bVar5 = copy_str_noinline<char32_t,char32_t*,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>>
                        ((char32_t *)local_88,fVar21.end,bVar5);
      return (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)bVar5.container;
    }
    fmt::v8::detail::assert_fail
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
               ,0x195,"negative value");
  case oct:
    lVar19 = -4;
    bVar5.container = out.container;
    lVar17 = 0;
    do {
      lVar18 = lVar17;
      lVar19 = lVar19 + 4;
      lVar17 = lVar18 + 1;
      bVar20 = (buffer<char32_t> *)0x7 < bVar5.container;
      bVar5.container = bVar5.container >> 3;
    } while (bVar20);
    iVar16 = (int)lVar17;
    if (((specs_00->field_0x9 & 0x80) != 0) &&
       (out.container != (buffer<char32_t> *)0x0 && specs_00->precision <= iVar16)) {
      uVar12 = 0x3000;
      if (uVar13 == 0) {
        uVar12 = 0x30;
      }
      uVar13 = (uVar12 | uVar13) + 0x1000000;
    }
    if (specs_00->precision != -1 || specs_00->width != 0) {
      write_int_data<char32_t>::write_int_data(&local_98,iVar16,uVar13,specs_00);
      local_88[0].data.size = local_98.size;
      local_88[0].data.padding = local_98.padding;
      local_88[0].prefix = uVar13;
      local_88[0].write_digits.num_digits = iVar16;
      bVar5 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,char32_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,char32_t,fmt::v8::detail::write_int<char32_t,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char32_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>)_4_>(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,int,unsigned_int,fmt::v8::basic_format_specs<char32_t>const&,fmt::v8::detail::write_int<char32_t,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char32_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>)_4_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>)_1_&>
                        ((back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)this,specs_00,
                         local_98.size,local_98.size,(anon_class_40_3_03e05ccd *)local_88);
      return (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)bVar5.container;
    }
    if ((uVar13 != 0) && ((uVar13 & 0xffffff) != 0)) {
      uVar10 = *(ulong *)(this + 0x10);
      uVar13 = uVar13 & 0xffffff;
      do {
        uVar1 = uVar10 + 1;
        uVar11 = uVar10;
        uVar10 = uVar1;
        if (*(ulong *)(this + 0x18) < uVar1) {
          (*(code *)**(undefined8 **)this)(this);
          uVar11 = *(ulong *)(this + 0x10);
          uVar10 = uVar11 + 1;
        }
        *(ulong *)(this + 0x10) = uVar10;
        *(uint *)(*(long *)(this + 8) + uVar11 * 4) = uVar13 & 0xff;
        bVar20 = 0xff < uVar13;
        uVar13 = uVar13 >> 8;
      } while (bVar20);
    }
    lVar3 = *(long *)(this + 0x10);
    uVar10 = lVar3 + lVar17;
    if (uVar10 <= *(ulong *)(this + 0x18)) {
      *(ulong *)(this + 0x10) = uVar10;
      if (*(long *)(this + 8) != 0) {
        puVar6 = (uint *)(*(long *)(this + 8) + lVar3 * 4 + lVar19);
        do {
          *puVar6 = (uint)out.container & 7 | 0x30;
          puVar6 = puVar6 + -1;
          bVar20 = (buffer<char32_t> *)0x7 < out.container;
          out.container = out.container >> 3;
        } while (bVar20);
        return (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)(buffer<char32_t> *)this;
      }
    }
    pbVar8 = (byte *)((long)&local_88[0].prefix + lVar18);
    pcVar7 = (char *)((long)&local_88[0].prefix + lVar18 + 1);
    do {
      *pbVar8 = (byte)out.container & 7 | 0x30;
      pbVar8 = pbVar8 + -1;
      bVar20 = (buffer<char32_t> *)0x7 < out.container;
      out.container = out.container >> 3;
    } while (bVar20);
    break;
  case hex_lower:
  case hex_upper:
    if ((specs_00->field_0x9 & 0x80) != 0) {
      uVar4 = (uint)(pVar2 != hex_upper) << 0xd | 0x5830;
      uVar12 = uVar4 << 8;
      if (uVar13 == 0) {
        uVar12 = uVar4;
      }
      uVar13 = (uVar12 | uVar13) + 0x2000000;
    }
    lVar19 = -4;
    bVar5.container = out.container;
    lVar17 = 0;
    do {
      lVar18 = lVar17;
      lVar19 = lVar19 + 4;
      lVar17 = lVar18 + 1;
      bVar20 = (buffer<char32_t> *)0xf < bVar5.container;
      bVar5.container = bVar5.container >> 4;
    } while (bVar20);
    if (specs_00->precision != -1 || specs_00->width != 0) {
      lVar19 = ((ulong)(pVar2 == hex_upper) << 0x20) + lVar17;
      write_int_data<char32_t>::write_int_data(&local_98,(int)lVar17,uVar13,specs_00);
      local_88[0].data.size = local_98.size;
      local_88[0].data.padding = local_98.padding;
      local_88[0].write_digits.num_digits = (int)lVar19;
      local_88[0].write_digits.upper = SUB81((ulong)lVar19 >> 0x20,0);
      local_88[0].prefix = uVar13;
      bVar5 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,char32_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,char32_t,fmt::v8::detail::write_int<char32_t,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char32_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>)_2_>(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,int,unsigned_int,fmt::v8::basic_format_specs<char32_t>const&,fmt::v8::detail::write_int<char32_t,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char32_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>)_2_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>)_1_&>
                        ((back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)this,specs_00,
                         local_98.size,local_98.size,local_88);
      return (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)bVar5.container;
    }
    if ((uVar13 != 0) && ((uVar13 & 0xffffff) != 0)) {
      uVar10 = *(ulong *)(this + 0x10);
      uVar13 = uVar13 & 0xffffff;
      do {
        uVar1 = uVar10 + 1;
        uVar11 = uVar10;
        uVar10 = uVar1;
        if (*(ulong *)(this + 0x18) < uVar1) {
          (*(code *)**(undefined8 **)this)(this);
          uVar11 = *(ulong *)(this + 0x10);
          uVar10 = uVar11 + 1;
        }
        *(ulong *)(this + 0x10) = uVar10;
        *(uint *)(*(long *)(this + 8) + uVar11 * 4) = uVar13 & 0xff;
        bVar20 = 0xff < uVar13;
        uVar13 = uVar13 >> 8;
      } while (bVar20);
    }
    lVar3 = *(long *)(this + 0x10);
    uVar10 = lVar3 + lVar17;
    if (uVar10 <= *(ulong *)(this + 0x18)) {
      *(ulong *)(this + 0x10) = uVar10;
      if (*(long *)(this + 8) != 0) {
        pcVar7 = "0123456789abcdef";
        if (pVar2 == hex_upper) {
          pcVar7 = "0123456789ABCDEF";
        }
        piVar14 = (int *)(*(long *)(this + 8) + lVar3 * 4 + lVar19);
        do {
          *piVar14 = (int)pcVar7[(uint)out.container & 0xf];
          piVar14 = piVar14 + -1;
          bVar20 = (buffer<char32_t> *)0xf < out.container;
          out.container = out.container >> 4;
        } while (bVar20);
        return (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)(buffer<char32_t> *)this;
      }
    }
    pcVar9 = (char *)((long)&local_88[0].prefix + lVar18);
    pcVar7 = (char *)((long)&local_88[0].prefix + lVar18 + 1);
    pcVar15 = "0123456789abcdef";
    if (pVar2 == hex_upper) {
      pcVar15 = "0123456789ABCDEF";
    }
    do {
      *pcVar9 = pcVar15[(uint)out.container & 0xf];
      pcVar9 = pcVar9 + -1;
      bVar20 = (buffer<char32_t> *)0xf < out.container;
      out.container = out.container >> 4;
    } while (bVar20);
    break;
  case bin_lower:
  case bin_upper:
    if ((specs_00->field_0x9 & 0x80) != 0) {
      uVar4 = (uint)(pVar2 != bin_upper) << 0xd | 0x4230;
      uVar12 = uVar4 << 8;
      if (uVar13 == 0) {
        uVar12 = uVar4;
      }
      uVar13 = (uVar12 | uVar13) + 0x2000000;
    }
    lVar19 = -4;
    bVar5.container = out.container;
    lVar17 = 0;
    do {
      lVar18 = lVar17;
      lVar19 = lVar19 + 4;
      lVar17 = lVar18 + 1;
      bVar20 = (buffer<char32_t> *)0x1 < bVar5.container;
      bVar5.container = bVar5.container >> 1;
    } while (bVar20);
    if (specs_00->precision != -1 || specs_00->width != 0) {
      write_int_data<char32_t>::write_int_data(&local_98,(int)lVar17,uVar13,specs_00);
      local_88[0].data.size = local_98.size;
      local_88[0].data.padding = local_98.padding;
      local_88[0].prefix = uVar13;
      local_88[0].write_digits.num_digits = (int)lVar17;
      bVar5 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,char32_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,char32_t,fmt::v8::detail::write_int<char32_t,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char32_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>)_3_>(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,int,unsigned_int,fmt::v8::basic_format_specs<char32_t>const&,fmt::v8::detail::write_int<char32_t,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char32_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>)_3_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>)_1_&>
                        ((back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)this,specs_00,
                         local_98.size,local_98.size,(anon_class_40_3_03e05ccd *)local_88);
      return (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)bVar5.container;
    }
    if ((uVar13 != 0) && ((uVar13 & 0xffffff) != 0)) {
      uVar10 = *(ulong *)(this + 0x10);
      uVar13 = uVar13 & 0xffffff;
      do {
        uVar1 = uVar10 + 1;
        uVar11 = uVar10;
        uVar10 = uVar1;
        if (*(ulong *)(this + 0x18) < uVar1) {
          (*(code *)**(undefined8 **)this)(this);
          uVar11 = *(ulong *)(this + 0x10);
          uVar10 = uVar11 + 1;
        }
        *(ulong *)(this + 0x10) = uVar10;
        *(uint *)(*(long *)(this + 8) + uVar11 * 4) = uVar13 & 0xff;
        bVar20 = 0xff < uVar13;
        uVar13 = uVar13 >> 8;
      } while (bVar20);
    }
    lVar3 = *(long *)(this + 0x10);
    uVar10 = lVar3 + lVar17;
    if (uVar10 <= *(ulong *)(this + 0x18)) {
      *(ulong *)(this + 0x10) = uVar10;
      if (*(long *)(this + 8) != 0) {
        puVar6 = (uint *)(*(long *)(this + 8) + lVar3 * 4 + lVar19);
        do {
          *puVar6 = (uint)out.container & 1 | 0x30;
          puVar6 = puVar6 + -1;
          bVar20 = (buffer<char32_t> *)0x1 < out.container;
          out.container = out.container >> 1;
        } while (bVar20);
        return (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)(buffer<char32_t> *)this;
      }
    }
    pbVar8 = (byte *)((long)&local_88[0].prefix + lVar18);
    pcVar7 = (char *)((long)&local_88[0].prefix + lVar18 + 1);
    do {
      *pbVar8 = (byte)out.container & 1 | 0x30;
      pbVar8 = pbVar8 + -1;
      bVar20 = (buffer<char32_t> *)0x1 < out.container;
      out.container = out.container >> 1;
    } while (bVar20);
    break;
  default:
    fmt::v8::detail::throw_format_error("invalid type specifier");
  case chr:
    local_88[0].prefix = (uint)out.container;
    bVar5 = write_padded<(fmt::v8::align::type)1,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,char32_t,fmt::v8::detail::write_char<char32_t,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>>(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,char32_t,fmt::v8::basic_format_specs<char32_t>const&)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>)_1_&>
                      ((back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)this,specs_00,1,1,
                       (anon_class_4_1_a8c68091 *)local_88);
    return (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)bVar5.container;
  }
  bVar5 = copy_str_noinline<char32_t,char*,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>>
                    ((char *)local_88,pcVar7,
                     (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)this);
  return (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)bVar5.container;
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(
    OutputIt out, write_int_arg<T> arg, const basic_format_specs<Char>& specs,
    locale_ref loc) -> OutputIt {
  return write_int(out, arg, specs, loc);
}